

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O3

void __thiscall chrono::viper::ViperPart::Construct(ViperPart *this,ChSystem *system)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  pointer pcVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined8 *puVar7;
  ChTriangleMeshShape *this_00;
  ChBodyAuxRef *pCVar8;
  double *size;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_col;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_vis;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  string vis_mesh_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_220;
  ChTriangleMeshShape *local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  long *local_208 [2];
  long local_1f8 [2];
  ChTriangleMeshShape *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  element_type *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1d0;
  long *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  element_type *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  ChBodyAuxRef *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  undefined *puStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined *puStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  ChMatrix33<double> local_168;
  long *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double dStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double local_38;
  
  local_1a8 = (ChBodyAuxRef *)(**(code **)(*(long *)system + 0x188))(system);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBodyAuxRef*>
            (&_Stack_1a0,local_1a8);
  _Var6._M_pi = _Stack_1a0._M_pi;
  pCVar8 = local_1a8;
  local_1a8 = (ChBodyAuxRef *)0x0;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pCVar8;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
    }
  }
  peVar2 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar3 = (this->m_name)._M_dataplus._M_p;
  local_1a8 = (ChBodyAuxRef *)&puStack_198;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar3,pcVar3 + (this->m_name)._M_string_length);
  std::__cxx11::string::append((char *)&local_1a8);
  std::__cxx11::string::_M_assign((string *)(peVar2 + 8));
  if (local_1a8 != (ChBodyAuxRef *)&puStack_198) {
    operator_delete(local_1a8,(ulong)(puStack_198 + 1));
  }
  chrono::ChVariablesBodyOwnMass::SetBodyMass(this->m_mass);
  chrono::ChBody::SetInertiaXX
            ((this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF
            ((ChFrame *)
             (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if (this->m_visualize == true) {
    std::operator+(&local_248,"robot/viper/obj/",&this->m_mesh_name);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
    pCVar8 = (ChBodyAuxRef *)(puVar7 + 2);
    if ((ChBodyAuxRef *)*puVar7 == pCVar8) {
      puStack_198 = *(undefined **)pCVar8;
      uStack_190 = puVar7[3];
      local_1a8 = (ChBodyAuxRef *)&puStack_198;
    }
    else {
      puStack_198 = *(undefined **)pCVar8;
      local_1a8 = (ChBodyAuxRef *)*puVar7;
    }
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar7[1];
    *puVar7 = pCVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    chrono::GetChronoDataFile((string *)local_208);
    if (local_1a8 != (ChBodyAuxRef *)&puStack_198) {
      operator_delete(local_1a8,(ulong)(puStack_198 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
              ((string *)&local_228,SUB81(local_208,0),true);
    local_e8 = (this->m_mesh_xform).coord.pos.m_data[0];
    dStack_e0 = (this->m_mesh_xform).coord.pos.m_data[1];
    size = &local_e8;
    local_d8 = (this->m_mesh_xform).coord.pos.m_data[2];
    local_38 = *(double *)
                ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x40);
    local_78 = (this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
    dStack_70 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 8);
    dStack_68 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x10);
    dStack_60 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x18);
    dStack_58 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x20);
    dStack_50 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x28);
    dStack_48 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x30);
    dStack_40 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x38);
    (**(code **)(*local_228 + 0x80))();
    chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
    this_00 = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)size)
    ;
    chrono::ChTriangleMeshShape::ChTriangleMeshShape(this_00);
    local_218 = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
              (&local_210,this_00);
    local_118 = local_228;
    p_Stack_110 = p_Stack_220;
    if (p_Stack_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_220->_M_use_count = p_Stack_220->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_220->_M_use_count = p_Stack_220->_M_use_count + 1;
      }
    }
    chrono::ChTriangleMeshShape::SetMesh(local_218,&local_118,1);
    if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
    }
    std::__cxx11::string::_M_assign((string *)(local_218 + 0x40));
    local_218[9] = (ChTriangleMeshShape)0x0;
    peVar2 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_1e8 = local_218;
    local_1e0 = local_210._M_pi;
    if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_210._M_pi)->_M_use_count = (local_210._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_210._M_pi)->_M_use_count = (local_210._M_pi)->_M_use_count + 1;
      }
    }
    local_248._M_dataplus._M_p = &DAT_3ff0000000000000;
    local_248._M_string_length = 0;
    local_248.field_2._M_allocated_capacity = 0;
    local_248.field_2._8_8_ = 0;
    local_1a8 = (ChBodyAuxRef *)&PTR__ChFrame_0017db90;
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puStack_198 = (undefined *)0x0;
    uStack_190 = 0;
    uStack_188 = 0x3ff0000000000000;
    puStack_180 = (undefined *)0x0;
    uStack_178 = 0;
    uStack_170 = 0;
    ChMatrix33<double>::ChMatrix33(&local_168,(ChQuaternion<double> *)&local_248);
    chrono::ChPhysicsItem::AddVisualShape(peVar2,&local_1e8,&local_1a8);
    if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
    }
    if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
    }
    if (p_Stack_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_220);
    }
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0],local_1f8[0] + 1);
    }
  }
  if (this->m_collide == true) {
    std::operator+(&local_248,"robot/viper/col/",&this->m_mesh_name);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_248);
    pCVar8 = (ChBodyAuxRef *)(puVar7 + 2);
    if ((ChBodyAuxRef *)*puVar7 == pCVar8) {
      puStack_198 = *(undefined **)pCVar8;
      uStack_190 = puVar7[3];
      local_1a8 = (ChBodyAuxRef *)&puStack_198;
    }
    else {
      puStack_198 = *(undefined **)pCVar8;
      local_1a8 = (ChBodyAuxRef *)*puVar7;
    }
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar7[1];
    *puVar7 = pCVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    chrono::GetChronoDataFile((string *)local_208);
    if (local_1a8 != (ChBodyAuxRef *)&puStack_198) {
      operator_delete(local_1a8,(ulong)(puStack_198 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
              ((string *)&local_248,SUB81(local_208,0),false);
    local_108 = (this->m_mesh_xform).coord.pos.m_data[0];
    dStack_100 = (this->m_mesh_xform).coord.pos.m_data[1];
    local_f8 = (this->m_mesh_xform).coord.pos.m_data[2];
    local_88 = *(double *)
                ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x40);
    local_c8 = (this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
    dStack_c0 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 8);
    dStack_b8 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x10);
    dStack_b0 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x18);
    dStack_a8 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x20);
    dStack_a0 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x28);
    dStack_98 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x30);
    dStack_90 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x38);
    (**(code **)(*(long *)local_248._M_dataplus._M_p + 0x80))();
    chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
    peVar2 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    plVar4 = *(long **)(peVar2 + 0x198);
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar2 + 0x1a0);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    (**(code **)(*plVar4 + 0x18))();
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    peVar2 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    plVar4 = *(long **)(peVar2 + 0x198);
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar2 + 0x1a0);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    local_1b8 = (this->m_mat).
                super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Stack_1b0 = (this->m_mat).
                  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    p_Var5 = (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    local_1c8 = (long *)local_248._M_dataplus._M_p;
    p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_248._M_string_length + 8) =
             *(_Atomic_word *)(local_248._M_string_length + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_248._M_string_length + 8) =
             *(_Atomic_word *)(local_248._M_string_length + 8) + 1;
      }
    }
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puStack_180 = SUB328(ZEXT832(0),4);
    uStack_178 = 0;
    uStack_170 = 0;
    local_1a8 = (ChBodyAuxRef *)&DAT_3ff0000000000000;
    uStack_188 = 0x3ff0000000000000;
    local_168.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    puStack_198 = puStack_180;
    uStack_190 = uStack_178;
    (**(code **)(*plVar4 + 0x80))(plVar4,&local_1b8,&local_1c8,0,0,&VNULL,&local_1a8);
    if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
    }
    if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
    }
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    peVar2 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    plVar4 = *(long **)(peVar2 + 0x198);
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar2 + 0x1a0);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    (**(code **)(*plVar4 + 0x20))();
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    chrono::ChBody::SetCollide
              (SUB81((this->m_body).
                     super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0))
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length);
    }
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0],local_1f8[0] + 1);
    }
  }
  local_1d8 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  p_Stack_1d0 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  p_Var1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (**(code **)(*(long *)system + 0x128))(system,&local_1d8);
  if (p_Stack_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1d0);
  }
  return;
}

Assistant:

void ViperPart::Construct(ChSystem* system) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(m_name + "_body");
    m_body->SetMass(m_mass);
    m_body->SetInertiaXX(m_inertia);
    m_body->SetFrame_COG_to_REF(m_cog);

    // Add visualization shape
    if (m_visualize) {
        auto vis_mesh_file = GetChronoDataFile("robot/viper/obj/" + m_mesh_name + ".obj");
        auto trimesh_vis = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, true, true);
        trimesh_vis->Transform(m_mesh_xform.GetPos(), m_mesh_xform.GetA());  // translate/rotate/scale mesh
        trimesh_vis->RepairDuplicateVertexes(1e-9);                          // if meshes are not watertight

        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh_vis);
        trimesh_shape->SetName(m_mesh_name);
        trimesh_shape->SetMutable(false);
        m_body->AddVisualShape(trimesh_shape);
    }

    // Add collision shape
    if (m_collide) {
        auto col_mesh_file = GetChronoDataFile("robot/viper/col/" + m_mesh_name + ".obj");
        auto trimesh_col = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(col_mesh_file, false, false);
        trimesh_col->Transform(m_mesh_xform.GetPos(), m_mesh_xform.GetA());  // translate/rotate/scale mesh
        trimesh_col->RepairDuplicateVertexes(1e-9);                          // if meshes are not watertight

        m_body->GetCollisionModel()->ClearModel();
        m_body->GetCollisionModel()->AddTriangleMesh(m_mat, trimesh_col, false, false, VNULL, ChMatrix33<>(1), 0.005);
        m_body->GetCollisionModel()->BuildModel();
        m_body->SetCollide(m_collide);
    }

    system->AddBody(m_body);
}